

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_Constructor_Test::TestBody
          (ConfidentialTransactionContext_Constructor_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *pcVar4;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ConfidentialTransactionContext copy_tx3;
  ConfidentialTransactionContext copy_tx2;
  ConfidentialTransaction ctx;
  ConfidentialTransactionContext copy_tx;
  ConfidentialTransactionContext byte_tx;
  ConfidentialTransactionContext str_tx;
  ConfidentialTransactionContext empty_tx;
  string exp_tx_str;
  string *in_stack_fffffffffffff848;
  ConfidentialTransactionContext *in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  char *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  ConfidentialTransactionContext *in_stack_fffffffffffff888;
  ConfidentialTransactionContext *in_stack_fffffffffffff890;
  ConfidentialTransactionContext *in_stack_fffffffffffff8a8;
  undefined7 in_stack_fffffffffffff8b0;
  undefined1 in_stack_fffffffffffff8b7;
  AssertHelper local_718;
  Message local_710;
  undefined4 local_708;
  uint32_t local_704;
  AssertionResult local_700;
  AssertHelper local_6f0;
  Message local_6e8;
  string local_6e0;
  string local_6c0;
  AssertionResult local_6a0;
  AssertHelper local_690;
  Message local_688;
  string local_680;
  string local_660;
  AssertionResult local_640;
  AssertHelper local_630;
  Message local_628;
  string local_620;
  string local_600;
  AssertionResult local_5e0;
  AssertHelper local_5d0;
  Message local_5c8;
  string local_5c0;
  string local_5a0;
  AssertionResult local_580;
  AssertHelper local_570;
  Message local_568;
  string local_560;
  string local_540;
  AssertionResult local_520;
  AbstractTransaction local_510 [11];
  AbstractTransaction local_458 [11];
  ConfidentialTransaction local_3a0;
  AbstractTransaction local_360 [11];
  allocator local_2a1;
  string local_2a0;
  ByteData local_280;
  AbstractTransaction local_268 [11];
  AbstractTransaction local_1b0 [11];
  AbstractTransaction local_f8 [12];
  allocator local_29;
  string local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_28,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2a0,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,&local_2a1);
  cfd::core::ByteData::ByteData(&local_280,&local_2a0);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_fffffffffffff890,(ByteData *)in_stack_fffffffffffff888);
  cfd::core::ByteData::~ByteData((ByteData *)0x214bd3);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_fffffffffffff8b7,in_stack_fffffffffffff8b0),in_stack_fffffffffffff8a8
            );
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&local_3a0,&local_28);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_fffffffffffff890,&in_stack_fffffffffffff888->super_ConfidentialTransaction);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::operator=
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_540,local_1b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_560,local_268);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_520,"str_tx.GetHex().c_str()","byte_tx.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x214ed4);
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    testing::Message::~Message((Message *)0x214f31);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x214f89);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_5a0,local_1b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_5c0,local_360);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_580,"str_tx.GetHex().c_str()","copy_tx.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_580);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2150c7);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    testing::Message::~Message((Message *)0x215124);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x21517c);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_600,local_1b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_620,local_458);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_5e0,"str_tx.GetHex().c_str()","copy_tx2.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2152ba);
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_630,&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    testing::Message::~Message((Message *)0x215317);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x21536f);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_660,local_1b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_680,local_510);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_640,"str_tx.GetHex().c_str()","copy_tx3.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_640);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2154ad);
    testing::internal::AssertHelper::AssertHelper
              (&local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_690,&local_688);
    testing::internal::AssertHelper::~AssertHelper(&local_690);
    testing::Message::~Message((Message *)0x21550a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x215562);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_6c0,local_1b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_6e0,local_f8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTRNE
            ((internal *)&local_6a0,"str_tx.GetHex().c_str()","empty_tx.GetHex().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_6c0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_6a0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_6e8);
    in_stack_fffffffffffff860 =
         testing::AssertionResult::failure_message((AssertionResult *)0x2156a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4c,in_stack_fffffffffffff860);
    testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper(&local_6f0);
    testing::Message::~Message((Message *)0x2156fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x215752);
  local_704 = cfd::ConfidentialTransactionContext::GetLockTimeDisabledSequence();
  local_708 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(uVar2,in_stack_fffffffffffff868),in_stack_fffffffffffff860,
             (uint *)CONCAT44(local_704,in_stack_fffffffffffff858),(uint *)in_stack_fffffffffffff850
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_700);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    in_stack_fffffffffffff850 =
         (ConfidentialTransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x215809);
    testing::internal::AssertHelper::AssertHelper
              (&local_718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4e,(char *)in_stack_fffffffffffff850);
    testing::internal::AssertHelper::operator=(&local_718,&local_710);
    testing::internal::AssertHelper::~AssertHelper(&local_718);
    testing::Message::~Message((Message *)0x215866);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2158bb);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            (&in_stack_fffffffffffff850->super_ConfidentialTransaction);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffff850);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, Constructor)
{
  std::string exp_tx_str = "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000";
  ConfidentialTransactionContext empty_tx;
  ConfidentialTransactionContext str_tx(exp_tx_str);
  ConfidentialTransactionContext byte_tx(
      ByteData("02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"));
  ConfidentialTransactionContext copy_tx(str_tx);
  ConfidentialTransaction ctx(exp_tx_str);
  ConfidentialTransactionContext copy_tx2(ctx);
  ConfidentialTransactionContext copy_tx3;
  copy_tx3 = str_tx;

  EXPECT_STREQ(str_tx.GetHex().c_str(), byte_tx.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx2.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx3.GetHex().c_str());
  EXPECT_STRNE(str_tx.GetHex().c_str(), empty_tx.GetHex().c_str());

  EXPECT_EQ(ConfidentialTransactionContext::GetLockTimeDisabledSequence(), 0xffffffffU);
}